

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * GenImageGradientV(Image *__return_storage_ptr__,int width,int height,Color top,Color bottom)

{
  char *pcVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ulong uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [16];
  void *pvVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  short sVar20;
  float fVar21;
  undefined1 auVar24 [16];
  float fVar25;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar22;
  undefined6 uVar23;
  
  pvVar16 = malloc((long)(height * width) << 2);
  auVar15 = _DAT_0015d900;
  if (0 < height) {
    auVar9[0xc] = bottom.a;
    auVar9._0_12_ = ZEXT712(0);
    uVar13 = (ulong)top._0_2_ & 0xffffffffffff00ff;
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar13;
    auVar10[0xc] = top.a;
    auVar11[8] = top.b;
    auVar11._0_8_ = uVar13;
    auVar11[9] = 0;
    auVar11._10_3_ = auVar10._10_3_;
    auVar14._5_8_ = 0;
    auVar14._0_5_ = auVar11._8_5_;
    auVar12[4] = top.g;
    auVar12._0_4_ = (int)uVar13;
    auVar12[5] = 0;
    auVar12._6_7_ = SUB137(auVar14 << 0x40,6);
    uVar17 = 0;
    pvVar18 = pvVar16;
    do {
      if (0 < width) {
        fVar21 = (float)(int)uVar17 / (float)height;
        fVar25 = 1.0 - fVar21;
        auVar24._0_4_ = (int)(fVar21 * (float)((uint)bottom & 0xff) + fVar25 * (float)(int)uVar13);
        auVar24._4_4_ =
             (int)(fVar21 * (float)((uint)bottom >> 8 & 0xff) + fVar25 * (float)auVar12._4_4_);
        auVar24._8_4_ =
             (int)(fVar21 * (float)(int)CONCAT32(auVar9._10_3_,(ushort)bottom.b) +
                  fVar25 * (float)auVar11._8_4_);
        auVar24._12_4_ =
             (int)(fVar21 * (float)(uint3)(auVar9._10_3_ >> 0x10) +
                  fVar25 * (float)(uint3)(auVar10._10_3_ >> 0x10));
        auVar24 = auVar24 & auVar15;
        sVar6 = auVar24._0_2_;
        cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar24[0] - (0xff < sVar6);
        sVar6 = auVar24._2_2_;
        sVar20 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar24[2] - (0xff < sVar6),cVar2);
        sVar6 = auVar24._4_2_;
        cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar24[4] - (0xff < sVar6);
        sVar6 = auVar24._6_2_;
        uVar22 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar24[6] - (0xff < sVar6),
                          CONCAT12(cVar3,sVar20));
        sVar6 = auVar24._8_2_;
        cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar24[8] - (0xff < sVar6);
        sVar6 = auVar24._10_2_;
        uVar23 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar24[10] - (0xff < sVar6),
                          CONCAT14(cVar4,uVar22));
        sVar6 = auVar24._12_2_;
        cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar24[0xc] - (0xff < sVar6);
        sVar8 = auVar24._14_2_;
        sVar6 = (short)((uint)uVar22 >> 0x10);
        sVar7 = (short)((uint6)uVar23 >> 0x20);
        sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar24[0xe] - (0xff < sVar8),
                                 CONCAT16(cVar5,uVar23)) >> 0x30);
        uVar19 = 0;
        do {
          pcVar1 = (char *)((long)pvVar18 + uVar19 * 4);
          *pcVar1 = (0 < sVar20) * (sVar20 < 0x100) * cVar2 - (0xff < sVar20);
          pcVar1[1] = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
          pcVar1[2] = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
          pcVar1[3] = (0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8);
          uVar19 = uVar19 + 1;
        } while ((uint)width != uVar19);
      }
      uVar17 = uVar17 + 1;
      pvVar18 = (void *)((long)pvVar18 + (ulong)(uint)width * 4);
    } while (uVar17 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar16;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientV(int width, int height, Color top, Color bottom)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int j = 0; j < height; j++)
    {
        float factor = (float)j/(float)height;
        for (int i = 0; i < width; i++)
        {
            pixels[j*width + i].r = (int)((float)bottom.r*factor + (float)top.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)bottom.g*factor + (float)top.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)bottom.b*factor + (float)top.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)bottom.a*factor + (float)top.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}